

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

pair<unsigned_long,_unsigned_long> absl::lts_20250127::PowFive(uint64_t num,int expfive)

{
  byte bVar1;
  ulong uVar2;
  undefined8 in_RCX;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> num_00;
  pair<unsigned_long,_unsigned_long> num_01;
  pair<unsigned_long,_unsigned_long> pVar6;
  unsigned_long uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  while( true ) {
    if (expfive < 0xd) break;
    num_00.second = 0x48c27395;
    num_00.first = uVar3;
    pVar6 = Mul32((lts_20250127 *)num,num_00,(uint32_t)in_RCX);
    uVar3 = pVar6.second;
    num = pVar6.first;
    expfive = expfive - 0xd;
  }
  num_01.second._0_4_ = *(undefined4 *)(&DAT_00642cb0 + (ulong)(expfive & 0xf) * 4);
  num_01.first = uVar3;
  num_01.second._4_4_ = 0;
  pVar6 = Mul32((lts_20250127 *)num,num_01,(uint32_t)in_RCX);
  uVar4 = pVar6.second;
  uVar2 = pVar6.first;
  if (uVar2 == 0) {
    uVar5 = 0x40;
  }
  else {
    uVar5 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x3f;
  }
  if (uVar5 != 0) {
    bVar1 = (byte)uVar5;
    pVar6.second = uVar4 << (bVar1 & 0x3f);
    pVar6.first = (uVar2 << (bVar1 & 0x3f)) + (uVar4 >> (-bVar1 & 0x3f));
  }
  return pVar6;
}

Assistant:

static std::pair<uint64_t, uint64_t> PowFive(uint64_t num, int expfive) {
  std::pair<uint64_t, uint64_t> result = {num, 0};
  while (expfive >= 13) {
    // 5^13 is the highest power of five that will fit in a 32-bit integer.
    result = Mul32(result, 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5);
    expfive -= 13;
  }
  constexpr uint32_t powers_of_five[13] = {
      1,
      5,
      5 * 5,
      5 * 5 * 5,
      5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
      5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5};
  result = Mul32(result, powers_of_five[expfive & 15]);
  int shift = countl_zero(result.first);
  if (shift != 0) {
    result.first = (result.first << shift) + (result.second >> (64 - shift));
    result.second = (result.second << shift);
  }
  return result;
}